

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::StrAppend(string *dest,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  size_type sVar7;
  long lVar8;
  char *out;
  char *begin;
  size_type old_size;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *dest_local;
  
  sVar2 = AlphaNum::size(a);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(a);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                  ,0xd2,
                  "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size(b);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(b);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                  ,0xd3,
                  "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size(c);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(c);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                  ,0xd4,
                  "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  lVar4 = std::__cxx11::string::size();
  sVar2 = AlphaNum::size(a);
  sVar6 = AlphaNum::size(b);
  sVar7 = AlphaNum::size(c);
  anon_unknown_5::STLStringAppendUninitializedAmortized(dest,sVar2 + sVar6 + sVar7);
  lVar8 = std::__cxx11::string::operator[]((ulong)dest);
  pcVar3 = anon_unknown_5::Append((char *)(lVar8 + lVar4),a);
  pcVar3 = anon_unknown_5::Append(pcVar3,b);
  pcVar3 = anon_unknown_5::Append(pcVar3,c);
  lVar4 = std::__cxx11::string::size();
  if (pcVar3 == (char *)(lVar8 + lVar4)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/str_cat.cc"
                ,0xdc,
                "void absl::StrAppend(std::string * _Nonnull, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(std::string* absl_nonnull dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size() + b.size() + c.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + dest->size());
}